

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O1

void Abc_NtkDfsReverseOne_rec(Abc_Obj_t *pObj,Vec_Int_t *vTfo,int nLevelMax,int nFanoutMax)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Abc_Ntk_t *pAVar4;
  Abc_Ntk_t *pAVar5;
  uint uVar6;
  ulong uVar7;
  int Fill;
  long lVar8;
  
  pAVar4 = pObj->pNtk;
  iVar1 = pObj->Id;
  Vec_IntFillExtra(&pAVar4->vTravIds,iVar1 + 1,nLevelMax);
  if (((long)iVar1 < 0) || ((pAVar4->vTravIds).nSize <= iVar1)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar5 = pObj->pNtk;
  iVar2 = pAVar5->nTravIds;
  if ((pAVar4->vTravIds).pArray[iVar1] != iVar2) {
    iVar1 = pObj->Id;
    Vec_IntFillExtra(&pAVar5->vTravIds,iVar1 + 1,Fill);
    if (((long)iVar1 < 0) || ((pAVar5->vTravIds).nSize <= iVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    (pAVar5->vTravIds).pArray[iVar1] = iVar2;
    uVar6 = *(uint *)&pObj->field_0x14 & 0xf;
    if ((int)(*(uint *)&pObj->field_0x14 >> 0xc) <= nLevelMax && 1 < uVar6 - 3) {
      if (uVar6 != 7) {
        __assert_fail("Abc_ObjIsNode( pObj )",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/sfm/sfmDec.c"
                      ,0x57b,"void Abc_NtkDfsReverseOne_rec(Abc_Obj_t *, Vec_Int_t *, int, int)");
      }
      uVar6 = (pObj->vFanouts).nSize;
      if ((int)uVar6 <= nFanoutMax) {
        if ((int)uVar6 < 1) {
          uVar7 = 0;
        }
        else {
          uVar7 = 0;
          do {
            uVar3 = *(uint *)((long)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[uVar7]] + 0x14
                             );
            if ((nLevelMax < (int)(uVar3 >> 0xc)) || ((uVar3 & 0xf) - 3 < 2)) goto LAB_004d195b;
            uVar7 = uVar7 + 1;
          } while (uVar6 != uVar7);
          uVar7 = (ulong)uVar6;
        }
LAB_004d195b:
        if (((uint)uVar7 == uVar6) && (0 < (pObj->vFanouts).nSize)) {
          lVar8 = 0;
          do {
            Abc_NtkDfsReverseOne_rec
                      ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar8]],vTfo,
                       nLevelMax,nFanoutMax);
            lVar8 = lVar8 + 1;
          } while (lVar8 < (pObj->vFanouts).nSize);
        }
      }
      Vec_IntPush(vTfo,pObj->Id);
      (pObj->field_6).iTemp = 0;
    }
  }
  return;
}

Assistant:

void Abc_NtkDfsReverseOne_rec( Abc_Obj_t * pObj, Vec_Int_t * vTfo, int nLevelMax, int nFanoutMax )
{
    Abc_Obj_t * pFanout; int i;
    if ( Abc_NodeIsTravIdCurrent( pObj ) )
        return;
    Abc_NodeSetTravIdCurrent( pObj );
    if ( Abc_ObjIsCo(pObj) || Abc_ObjLevel(pObj) > nLevelMax )
        return;
    assert( Abc_ObjIsNode( pObj ) );
    if ( Abc_ObjFanoutNum(pObj) <= nFanoutMax )
    {
        Abc_ObjForEachFanout( pObj, pFanout, i )
            if ( Abc_ObjIsCo(pFanout) || Abc_ObjLevel(pFanout) > nLevelMax )
                break;
        if ( i == Abc_ObjFanoutNum(pObj) )
            Abc_ObjForEachFanout( pObj, pFanout, i )
                Abc_NtkDfsReverseOne_rec( pFanout, vTfo, nLevelMax, nFanoutMax );
    }
    Vec_IntPush( vTfo, Abc_ObjId(pObj) );
    pObj->iTemp = 0;
}